

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.cpp
# Opt level: O2

int __thiscall
glslang::TScanContext::nonreservedKeyword(TScanContext *this,int esVersion,int nonEsVersion)

{
  TParseContextBase *pTVar1;
  int iVar2;
  
  pTVar1 = this->parseContext;
  iVar2 = (pTVar1->super_TParseVersions).version;
  if ((pTVar1->super_TParseVersions).profile == EEsProfile) {
    if (iVar2 < esVersion) {
LAB_0042e740:
      if ((pTVar1->super_TParseVersions).forwardCompatible == true) {
        (*(pTVar1->super_TParseVersions)._vptr_TParseVersions[0x2e])
                  (pTVar1,&this->loc,"using future keyword",this->tokenText,"");
      }
      iVar2 = identifierOrType(this);
      return iVar2;
    }
  }
  else if (iVar2 < nonEsVersion) goto LAB_0042e740;
  return this->keyword;
}

Assistant:

int TScanContext::nonreservedKeyword(int esVersion, int nonEsVersion)
{
    if ((parseContext.isEsProfile() && parseContext.version < esVersion) ||
        (!parseContext.isEsProfile() && parseContext.version < nonEsVersion)) {
        if (parseContext.isForwardCompatible())
            parseContext.warn(loc, "using future keyword", tokenText, "");

        return identifierOrType();
    }

    return keyword;
}